

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMRangeImpl::insertNode(DOMRangeImpl *this,DOMNode *newNode)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DOMException *pDVar5;
  DOMRangeException *this_00;
  DOMNodeImpl *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong local_48;
  XMLSize_t i;
  DOMNode *next;
  DOMNode *parent;
  DOMNode *aNode;
  int type;
  DOMNode *newNode_local;
  DOMRangeImpl *this_local;
  
  if (newNode != (DOMNode *)0x0) {
    if ((this->fDetached & 1U) != 0) {
      pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(pDVar5,0xb,0,this->fMemoryManager);
      __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
    }
    iVar3 = (*newNode->_vptr_DOMNode[4])();
    if ((((iVar3 == 2) || (iVar3 == 6)) || (iVar3 == 0xc)) || (iVar3 == 9)) {
      this_00 = (DOMRangeException *)__cxa_allocate_exception(0x28);
      DOMRangeException::DOMRangeException(this_00,0x70,0,this->fMemoryManager);
      __cxa_throw(this_00,&DOMRangeException::typeinfo,DOMRangeException::~DOMRangeException);
    }
    bVar2 = isAncestorOf(newNode,this->fStartContainer);
    if (bVar2) {
      pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(pDVar5,3,0,this->fMemoryManager);
      __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
    }
    parent = this->fStartContainer;
    while (parent != (DOMNode *)0x0) {
      this_01 = xercesc_4_0::castToNodeImpl(newNode);
      bVar2 = DOMNodeImpl::isReadOnly(this_01);
      if (bVar2) {
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(pDVar5,7,0,this->fMemoryManager);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
      iVar3 = (*parent->_vptr_DOMNode[5])();
      parent = (DOMNode *)CONCAT44(extraout_var,iVar3);
    }
    pDVar1 = this->fDocument;
    iVar3 = (*newNode->_vptr_DOMNode[0xc])();
    if (pDVar1 != (DOMDocument *)CONCAT44(extraout_var_00,iVar3)) {
      pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(pDVar5,4,0,this->fMemoryManager);
      __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
    }
    iVar3 = (*this->fStartContainer->_vptr_DOMNode[4])();
    if (((iVar3 == 3) || (iVar3 == 4)) || ((iVar3 == 8 || (iVar3 == 7)))) {
      iVar4 = (*this->fStartContainer->_vptr_DOMNode[5])();
      next = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
      if (this->fStartOffset != 0) {
        if (iVar3 == 8) {
          DOMCommentImpl::splitText((DOMCommentImpl *)this->fStartContainer,this->fStartOffset);
        }
        else if (iVar3 == 7) {
          DOMProcessingInstructionImpl::splitText
                    ((DOMProcessingInstructionImpl *)this->fStartContainer,this->fStartOffset);
        }
        else {
          (*this->fStartContainer->_vptr_DOMNode[0x30])(this->fStartContainer,this->fStartOffset);
        }
      }
      if (this->fStartOffset == 0) {
        i = (XMLSize_t)this->fStartContainer;
      }
      else {
        iVar3 = (*this->fStartContainer->_vptr_DOMNode[10])();
        i = CONCAT44(extraout_var_02,iVar3);
      }
    }
    else {
      next = this->fStartContainer;
      iVar3 = (*this->fStartContainer->_vptr_DOMNode[7])();
      i = CONCAT44(extraout_var_03,iVar3);
      for (local_48 = 0; local_48 < this->fStartOffset && i != 0; local_48 = local_48 + 1) {
        i = (**(code **)(*(long *)i + 0x50))();
      }
    }
    if (next != (DOMNode *)0x0) {
      if (i == 0) {
        (*next->_vptr_DOMNode[0x11])(next,newNode);
      }
      else {
        (*next->_vptr_DOMNode[0xe])(next,newNode,i);
      }
    }
  }
  return;
}

Assistant:

void DOMRangeImpl::insertNode(DOMNode* newNode)
{
    if (newNode == 0) return; //don't have to do anything

    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }

    int type = newNode->getNodeType();
    if (type == DOMNode::ATTRIBUTE_NODE
        || type == DOMNode::ENTITY_NODE
        || type == DOMNode::NOTATION_NODE
        || type == DOMNode::DOCUMENT_NODE)
    {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // Prevent cycles in the tree.
    //isKidOK() is not checked here as its taken care by insertBefore() function
    if (isAncestorOf( newNode, fStartContainer)) {
        throw DOMException(
            DOMException::HIERARCHY_REQUEST_ERR, 0, fMemoryManager);
    }

    for (DOMNode* aNode = fStartContainer; aNode!=0; aNode = aNode->getParentNode()) {
        if (castToNodeImpl(newNode)->isReadOnly()) {
        throw DOMException(
            DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, fMemoryManager);
    }
    }

    if (fDocument != newNode->getOwnerDocument()) {
        throw DOMException(
            DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
    }


    DOMNode* parent;
    DOMNode* next;

    type = fStartContainer->getNodeType();
    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE)) {

        //set 'parent' and 'next' here
        parent = fStartContainer->getParentNode();

        //split the text nodes
       if (fStartOffset > 0) {
           if (type == DOMNode::COMMENT_NODE)
               ((DOMCommentImpl*)fStartContainer)->splitText(fStartOffset);
           else if (type == DOMNode::PROCESSING_INSTRUCTION_NODE)
               ((DOMProcessingInstructionImpl*)fStartContainer)->splitText(fStartOffset);
           else
               ((DOMText*)fStartContainer)->splitText(fStartOffset);
       }

        //update the new start information later. After inserting the first newNode
        if (fStartOffset == 0)
            next = fStartContainer;
        else
            next = fStartContainer->getNextSibling();

    } // end of text handling
    else {
        parent = fStartContainer;

        next = fStartContainer->getFirstChild();
        for(XMLSize_t i = 0; (i < fStartOffset) && (next != 0); i++) {
            next=next->getNextSibling();
        }
    }

    if (parent != 0) {
        if (next != 0)
            parent->insertBefore(newNode, next);
        else
            parent->appendChild(newNode);
    }
}